

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  unsigned_long_long uVar1;
  U32 UVar2;
  uint uVar3;
  size_t code;
  ZSTD_frameSizeInfo ZVar4;
  unsigned_long_long local_a8;
  size_t cBlockSize;
  int local_90;
  blockProperties_t blockProperties;
  size_t ret;
  ZSTD_frameHeader zfh;
  size_t nbBlocks;
  size_t remainingSize;
  BYTE *ipstart;
  BYTE *ip;
  ZSTD_frameSizeInfo frameSizeInfo;
  size_t srcSize_local;
  void *src_local;
  size_t local_10;
  
  frameSizeInfo.decompressedBound = srcSize;
  memset(&ip,0,0x10);
  if ((frameSizeInfo.decompressedBound < 8) ||
     (UVar2 = MEM_readLE32(src), (UVar2 & 0xfffffff0) != 0x184d2a50)) {
    uVar1 = frameSizeInfo.decompressedBound;
    zfh.checksumFlag = 0;
    zfh._36_4_ = 0;
    blockProperties._4_8_ =
         ZSTD_getFrameHeader((ZSTD_frameHeader *)&ret,src,frameSizeInfo.decompressedBound);
    uVar3 = ERR_isError(blockProperties._4_8_);
    if (uVar3 == 0) {
      if (blockProperties._4_8_ == 0) {
        ipstart = (BYTE *)((long)src + (ulong)zfh.blockSizeMax);
        nbBlocks = uVar1 - zfh.blockSizeMax;
        do {
          code = ZSTD_getcBlockSize(ipstart,nbBlocks,(blockProperties_t *)((long)&cBlockSize + 4));
          uVar3 = ERR_isError(code);
          if (uVar3 != 0) {
            ZVar4 = ZSTD_errorFrameSizeInfo(code);
            return ZVar4;
          }
          if (nbBlocks < code + 3) {
            ZVar4 = ZSTD_errorFrameSizeInfo(0xffffffffffffffb8);
            return ZVar4;
          }
          ipstart = ipstart + code + 3;
          nbBlocks = nbBlocks - (code + 3);
          zfh._32_8_ = zfh._32_8_ + 1;
        } while (local_90 == 0);
        if (zfh.headerSize != 0) {
          if (nbBlocks < 4) {
            ZVar4 = ZSTD_errorFrameSizeInfo(0xffffffffffffffb8);
            return ZVar4;
          }
          ipstart = ipstart + 4;
        }
        if (ret == 0xffffffffffffffff) {
          local_a8 = zfh._32_8_ * (ulong)(uint)zfh.windowSize;
        }
        else {
          local_a8 = ret;
        }
        local_10 = local_a8;
        src_local = (void *)((long)ipstart - (long)src);
      }
      else {
        _src_local = ZSTD_errorFrameSizeInfo(0xffffffffffffffb8);
      }
    }
    else {
      _src_local = ZSTD_errorFrameSizeInfo(blockProperties._4_8_);
    }
  }
  else {
    src_local = (void *)readSkippableFrameSize(src,frameSizeInfo.decompressedBound);
    local_10 = frameSizeInfo.compressedSize;
  }
  return _src_local;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = ip - ipstart;
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}